

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stbfile * stb_arith_encode_close(stb_arith *a)

{
  stb_arith *a_local;
  
  stb__arith_putbyte(a,a->range_low >> 0x18);
  stb__arith_putbyte(a,a->range_low >> 0x10);
  stb__arith_putbyte(a,a->range_low >> 8);
  stb__arith_putbyte(a,a->range_low);
  stb__arith_flush(a);
  return a->output;
}

Assistant:

stbfile *stb_arith_encode_close(stb_arith *a)
{
   // put exactly as many bytes as we'll read, so we can turn on/off arithmetic coding in a stream
   stb__arith_putbyte(a, a->range_low >> 24);
   stb__arith_putbyte(a, a->range_low >> 16);
   stb__arith_putbyte(a, a->range_low >>  8);
   stb__arith_putbyte(a, a->range_low >>  0);
   stb__arith_flush(a);
   return a->output;
}